

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O3

bool SearchHelper(ON_RTreeNode *a_node,ON_RTreeBBox *a_rect,ON_RTreeSearchResult *a_result)

{
  uint uVar1;
  int iVar2;
  ON__INT_PTR *pOVar3;
  ON__INT_PTR OVar4;
  bool bVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  
  uVar1 = a_node->m_count;
  if (0 < (int)uVar1) {
    if (a_node->m_level < 1) {
      iVar2 = a_result->m_capacity;
      iVar7 = a_result->m_count;
      pOVar3 = a_result->m_id;
      lVar8 = 0;
      do {
        bVar5 = OverlapHelper(a_rect,(ON_RTreeBBox *)
                                     ((long)a_node->m_branch[0].m_rect.m_min + lVar8));
        if (bVar5) {
          if (iVar2 <= iVar7) {
            return false;
          }
          OVar4 = *(ON__INT_PTR *)((long)(&a_node->m_branch[0].m_rect + 1) + lVar8);
          lVar6 = (long)iVar7;
          iVar7 = iVar7 + 1;
          a_result->m_count = iVar7;
          pOVar3[lVar6] = OVar4;
        }
        lVar8 = lVar8 + 0x38;
      } while ((ulong)uVar1 * 0x38 - lVar8 != 0);
    }
    else {
      lVar8 = 0;
      do {
        bVar5 = OverlapHelper(a_rect,(ON_RTreeBBox *)
                                     ((long)a_node->m_branch[0].m_rect.m_min + lVar8));
        if ((bVar5) &&
           (bVar5 = SearchHelper(*(ON_RTreeNode **)((long)(&a_node->m_branch[0].m_rect + 1) + lVar8)
                                 ,a_rect,a_result), !bVar5)) {
          return false;
        }
        lVar8 = lVar8 + 0x38;
      } while ((ulong)uVar1 * 0x38 - lVar8 != 0);
    }
  }
  return true;
}

Assistant:

static
bool SearchHelper(const ON_RTreeNode* a_node, const ON_RTreeBBox* a_rect, ON_RTreeSearchResult& a_result)
{
  int i, count;

  if ( (count = a_node->m_count) > 0 )
  {
    const ON_RTreeBranch* branch = a_node->m_branch;
    if(a_node->IsInternalNode()) 
    {
      // a_node is an internal node - search m_branch[].m_child as needed
      for( i=0; i < count; ++i )
      {
        if(OverlapHelper(a_rect, &branch[i].m_rect))
        {
          if(!SearchHelper(branch[i].m_child, a_rect, a_result) )
          {
            return false; // Don't continue searching
          }
        }
      }
    }
    else
    {
      // a_node is a leaf node - return m_branch[].m_id values
      for(i=0; i < count; ++i)
      {
        if(OverlapHelper(a_rect, &branch[i].m_rect))
        {
          if ( a_result.m_count >= a_result.m_capacity )
            return false; // No more space for results
          a_result.m_id[a_result.m_count++] = branch[i].m_id;
        }
      }
    }
  }

  return true; // Continue searching
}